

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O3

void intgemm::kernel_quantize_test<(intgemm::CPUType)4>(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  float fVar7;
  undefined1 in_XMM2 [16];
  AlignedVector<int> output;
  AlignedVector<float> input;
  AssertionHandler catchAssertionHandler;
  int local_f4;
  AlignedVector<int> local_f0;
  long local_e0;
  AlignedVector<float> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  long local_a8;
  char *local_a0;
  size_t sStack_98;
  int *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (3 < kCPU) {
    AlignedVector<float>::AlignedVector(&local_d8,0x10,0x40);
    AlignedVector<int>::AlignedVector(&local_f0,0x10,0x40);
    if (local_d8.size_ != 0) {
      fVar7 = 0.0;
      lVar3 = 0;
      do {
        *(float *)((undefined1 *)local_d8.mem_ + lVar3) = fVar7;
        fVar7 = fVar7 + 1.0;
        lVar3 = lVar3 + 4;
      } while (local_d8.size_ << 2 != lVar3);
    }
    auVar6 = vaddps_avx512f(*(undefined1 (*) [64])local_d8.mem_,*(undefined1 (*) [64])local_d8.mem_)
    ;
    auVar6 = vcvtps2dq_avx512f(auVar6);
    *(undefined1 (*) [64])local_f0.mem_ = auVar6;
    if (local_f0.size_ != 0) {
      local_e0 = 0;
      uVar5 = 0;
      do {
        local_b8._vptr_ITransientExpression = (_func_int **)0x1b2b11;
        local_b8.m_isBinaryExpression = true;
        local_b8.m_result = false;
        local_b8._10_6_ = 0;
        local_c8.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/quantize_test.cc"
        ;
        local_c8.line = 0x19;
        Catch::StringRef::StringRef(&local_88,"output[i] == int(i*2.f)");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
        auVar2 = vcvtusi2ss_avx512f(in_XMM2,uVar5);
        iVar4 = (int)(auVar2._0_4_ + auVar2._0_4_);
        iVar1 = *(int *)((long)local_f0.mem_ + local_e0);
        lVar3 = (long)local_f0.mem_ + local_e0;
        local_f4 = iVar4;
        Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
        local_b8.m_result = iVar1 == iVar4;
        local_b8.m_isBinaryExpression = true;
        local_b8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001eb958;
        local_a0 = local_c8.file;
        sStack_98 = local_c8.line;
        local_90 = &local_f4;
        local_a8 = lVar3;
        Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
        Catch::ITransientExpression::~ITransientExpression(&local_b8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        uVar5 = uVar5 + 1;
        local_e0 = local_e0 + 4;
      } while (uVar5 < local_f0.size_);
    }
    free(local_f0.mem_);
    free(local_d8.mem_);
  }
  return;
}

Assistant:

void kernel_quantize_test() {
  if (kCPU < CPUType_)
    return;

  using input_vec_t = vector_t<CPUType_, float>;
  using output_vec_t = vector_t<CPUType_, int>;

  AlignedVector<float> input(sizeof(input_vec_t) / sizeof(float));
  AlignedVector<int> output(sizeof(output_vec_t) / sizeof(int));

  std::iota(input.begin(), input.end(), 0.0f);
  auto quant_mult = set1_ps<input_vec_t>(2.f);

  *output.template as<output_vec_t>() = kernels::quantize(*input.template as<input_vec_t>(), quant_mult);
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int(i*2.f));
}